

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

iterator __thiscall
phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
::internal_find<int>
          (btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
           *this,int *key)

{
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
  *pbVar1;
  SearchResult<int,_false> SVar2;
  btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>> *this_00;
  ulong uVar3;
  iterator iVar4;
  
  this_00 = (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
             *)(this->root_).
               super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
               .
               super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
               .
               super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
               .
               super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
               ._M_head_impl;
  SVar2 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>::
          linear_search<int,phmap::Less<int>>(this_00,key,(Less<int> *)this);
  while (((ulong)this_00 & 7) == 0) {
    uVar3 = (ulong)(uint)SVar2.value;
    if (((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
          *)this_00)[0xb] !=
        (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
        )0x0) goto LAB_002266d8;
    this_00 = (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
               *)btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                 ::child((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                          *)this_00,(long)SVar2.value);
    SVar2 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>::
            linear_search<int,phmap::Less<int>>(this_00,key,(Less<int> *)this);
  }
LAB_002266a4:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
LAB_002266d8:
  if (((ulong)this_00 & 7) != 0) goto LAB_002266a4;
  if ((uint)uVar3 !=
      (uint)(byte)((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                    *)this_00)[10]) goto LAB_002266ec;
  pbVar1 = *(btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
             **)this_00;
  if (((ulong)pbVar1 & 7) != 0) goto LAB_002266a4;
  uVar3 = (ulong)(byte)((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                         *)this_00)[8];
  this_00 = (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
             *)pbVar1;
  if (pbVar1[0xb] !=
      (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>)
      0x0) {
    this_00 = (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
               *)0x0;
LAB_002266ec:
    if ((this_00 ==
         (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>> *)
         0x0) || (*key < *(int *)((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                                   *)this_00 + (long)(int)uVar3 * 4 + 0xc))) {
      uVar3 = 0;
      this_00 = (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
                 *)0x0;
    }
    iVar4._8_8_ = uVar3;
    iVar4.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                  *)this_00;
    return iVar4;
  }
  goto LAB_002266d8;
}

Assistant:

auto btree<P>::internal_find(const K &key) const -> iterator {
        auto res = internal_locate(key);
        if (res.HasMatch()) {
            if (res.IsEq()) {
                return res.value;
            }
        } else {
            const iterator iter = internal_last(res.value);
            if (iter.node != nullptr && !compare_keys(key, iter.key())) {
                return iter;
            }
        }
        return {nullptr, 0};
    }